

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test10::prepareVertexShaderCode
          (GPUShaderFP64Test10 *this,functionObject *function_object)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  GLchar *pGVar7;
  GLchar *pGVar8;
  _variable_type type;
  _variable_type type_00;
  _variable_type type_01;
  GLchar *varying_name_1;
  GLuint result_1;
  GLchar *uniform_name_1;
  undefined1 local_f0 [4];
  GLuint argument_1;
  string varying_type;
  GLchar *varying_name;
  _variable_type variable_type;
  GLuint result;
  string uniform_type;
  GLchar *uniform_name;
  uint local_90;
  _variable_type argument_type;
  GLuint argument;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string string;
  size_t search_position;
  string result_type;
  GLuint result_definition_length;
  GLuint n_results;
  GLuint n_arguments;
  GLuint first_argument_length;
  GLuint argument_definition_length;
  functionObject *function_object_local;
  GPUShaderFP64Test10 *this_local;
  
  sVar4 = strlen(prepareVertexShaderCode::argument_definition);
  sVar5 = strlen(prepareVertexShaderCode::first_argument);
  uVar1 = (*function_object->_vptr_functionObject[3])();
  uVar2 = (*function_object->_vptr_functionObject[5])();
  sVar6 = strlen(prepareVertexShaderCode::result_definition);
  result_type.field_2._12_4_ = (undefined4)sVar6;
  uVar3 = (*function_object->_vptr_functionObject[6])(function_object,0);
  Utils::getVariableTypeString_abi_cxx11_((string *)&search_position,(Utils *)(ulong)uVar3,type);
  pGVar8 = prepareVertexShaderCode::shader_template_code;
  string.field_2._8_8_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,pGVar8,&local_79);
  std::allocator<char>::~allocator(&local_79);
  for (local_90 = 0; local_90 < uVar1; local_90 = local_90 + 1) {
    uVar3 = (*function_object->_vptr_functionObject[4])(function_object,(ulong)local_90);
    uniform_type.field_2._8_8_ = getUniformName(this,local_90);
    Utils::getVariableTypeString_abi_cxx11_((string *)&variable_type,(Utils *)(ulong)uVar3,type_00);
    Utils::replaceToken(prepareVertexShaderCode::argument_definition_token,
                        (size_t *)(string.field_2._M_local_buf + 8),
                        prepareVertexShaderCode::argument_definition,(string *)local_78);
    pGVar8 = prepareVertexShaderCode::uniform_type_token;
    string.field_2._8_8_ = string.field_2._8_8_ - (sVar4 & 0xffffffff);
    pGVar7 = (GLchar *)std::__cxx11::string::c_str();
    Utils::replaceToken(pGVar8,(size_t *)(string.field_2._M_local_buf + 8),pGVar7,(string *)local_78
                       );
    Utils::replaceToken(prepareVertexShaderCode::uniform_name_token,
                        (size_t *)(string.field_2._M_local_buf + 8),
                        (GLchar *)uniform_type.field_2._8_8_,(string *)local_78);
    std::__cxx11::string::~string((string *)&variable_type);
  }
  Utils::replaceToken(prepareVertexShaderCode::argument_definition_token,
                      (size_t *)(string.field_2._M_local_buf + 8),"",(string *)local_78);
  for (varying_name._4_4_ = 0; varying_name._4_4_ < uVar2;
      varying_name._4_4_ = varying_name._4_4_ + 1) {
    uVar3 = (*function_object->_vptr_functionObject[6])(function_object,(ulong)varying_name._4_4_);
    varying_type.field_2._8_8_ = getVaryingName(this,varying_name._4_4_);
    Utils::getVariableTypeString_abi_cxx11_((string *)local_f0,(Utils *)(ulong)uVar3,type_01);
    Utils::replaceToken(prepareVertexShaderCode::result_definition_token,
                        (size_t *)(string.field_2._M_local_buf + 8),
                        prepareVertexShaderCode::result_definition,(string *)local_78);
    pGVar8 = prepareVertexShaderCode::result_type_token;
    string.field_2._8_8_ = string.field_2._8_8_ - (ulong)(uint)result_type.field_2._12_4_;
    pGVar7 = (GLchar *)std::__cxx11::string::c_str();
    Utils::replaceToken(pGVar8,(size_t *)(string.field_2._M_local_buf + 8),pGVar7,(string *)local_78
                       );
    Utils::replaceToken(prepareVertexShaderCode::result_name_token,
                        (size_t *)(string.field_2._M_local_buf + 8),
                        (GLchar *)varying_type.field_2._8_8_,(string *)local_78);
    std::__cxx11::string::~string((string *)local_f0);
  }
  Utils::replaceToken(prepareVertexShaderCode::result_definition_token,
                      (size_t *)(string.field_2._M_local_buf + 8),"",(string *)local_78);
  pGVar8 = prepareVertexShaderCode::result_name_token;
  pGVar7 = getVaryingName(this,0);
  Utils::replaceToken(pGVar8,(size_t *)(string.field_2._M_local_buf + 8),pGVar7,(string *)local_78);
  pGVar8 = prepareVertexShaderCode::result_type_token;
  pGVar7 = (GLchar *)std::__cxx11::string::c_str();
  Utils::replaceToken(pGVar8,(size_t *)(string.field_2._M_local_buf + 8),pGVar7,(string *)local_78);
  pGVar8 = prepareVertexShaderCode::function_name_token;
  pGVar7 = functionObject::getName(function_object);
  Utils::replaceToken(pGVar8,(size_t *)(string.field_2._M_local_buf + 8),pGVar7,(string *)local_78);
  for (uniform_name_1._4_4_ = 0; uniform_name_1._4_4_ < uVar1;
      uniform_name_1._4_4_ = uniform_name_1._4_4_ + 1) {
    pGVar8 = getUniformName(this,uniform_name_1._4_4_);
    if (uniform_name_1._4_4_ == 0) {
      Utils::replaceToken(prepareVertexShaderCode::argument_token,
                          (size_t *)(string.field_2._M_local_buf + 8),
                          prepareVertexShaderCode::first_argument,(string *)local_78);
    }
    else {
      Utils::replaceToken(prepareVertexShaderCode::argument_token,
                          (size_t *)(string.field_2._M_local_buf + 8),
                          prepareVertexShaderCode::argument_str,(string *)local_78);
    }
    string.field_2._8_8_ = string.field_2._8_8_ - (sVar5 & 0xffffffff);
    Utils::replaceToken(prepareVertexShaderCode::uniform_name_token,
                        (size_t *)(string.field_2._M_local_buf + 8),pGVar8,(string *)local_78);
  }
  for (varying_name_1._4_4_ = 1; varying_name_1._4_4_ < uVar2;
      varying_name_1._4_4_ = varying_name_1._4_4_ + 1) {
    pGVar8 = getVaryingName(this,varying_name_1._4_4_);
    Utils::replaceToken(prepareVertexShaderCode::argument_token,
                        (size_t *)(string.field_2._M_local_buf + 8),
                        prepareVertexShaderCode::argument_str,(string *)local_78);
    string.field_2._8_8_ = string.field_2._8_8_ - (sVar5 & 0xffffffff);
    Utils::replaceToken(prepareVertexShaderCode::uniform_name_token,
                        (size_t *)(string.field_2._M_local_buf + 8),pGVar8,(string *)local_78);
  }
  Utils::replaceToken(prepareVertexShaderCode::argument_token,
                      (size_t *)(string.field_2._M_local_buf + 8),"",(string *)local_78);
  std::__cxx11::string::operator=((string *)&this->m_vertex_shader_code,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)&search_position);
  return;
}

Assistant:

void GPUShaderFP64Test10::prepareVertexShaderCode(const functionObject& function_object)
{
	static const glw::GLchar* shader_template_code = "#version 400 core\n"
													 "\n"
													 "precision highp float;\n"
													 "\n"
													 "ARGUMENT_DEFINITION"
													 "\n"
													 "RESULT_DEFINITION"
													 "\n"
													 "void main()\n"
													 "{\n"
													 "    RESULT_NAME = RESULT_TYPE(FUNCTION_NAME(ARGUMENT));\n"
													 "}\n"
													 "\n";

	static const glw::GLchar* argument_definition_token = "ARGUMENT_DEFINITION";
	static const glw::GLchar* argument_token			= "ARGUMENT";
	static const glw::GLchar* function_name_token		= "FUNCTION_NAME";
	static const glw::GLchar* result_definition_token   = "RESULT_DEFINITION";
	static const glw::GLchar* result_name_token			= "RESULT_NAME";
	static const glw::GLchar* result_type_token			= "RESULT_TYPE";
	static const glw::GLchar* uniform_name_token		= "UNIFORM_NAME";
	static const glw::GLchar* uniform_type_token		= "UNIFORM_TYPE";

	static const glw::GLchar* argument_definition = "uniform UNIFORM_TYPE UNIFORM_NAME;\nARGUMENT_DEFINITION";
	static const glw::GLchar* argument_str		  = ", UNIFORM_NAMEARGUMENT";
	static const glw::GLchar* first_argument	  = "UNIFORM_NAMEARGUMENT";
	static const glw::GLchar* result_definition   = "flat out RESULT_TYPE RESULT_NAME;\nRESULT_DEFINITION";

	const glw::GLuint argument_definition_length = (glw::GLuint)strlen(argument_definition);
	const glw::GLuint first_argument_length		 = (glw::GLuint)strlen(first_argument);
	const glw::GLuint n_arguments				 = function_object.getArgumentCount();
	const glw::GLuint n_results					 = function_object.getResultCount();
	const glw::GLuint result_definition_length   = (glw::GLuint)strlen(result_definition);
	std::string		  result_type				 = Utils::getVariableTypeString(function_object.getResultType(0));

	size_t		search_position = 0;
	std::string string			= shader_template_code;

	/* Replace ARGUMENT_DEFINITION with definitions */
	for (glw::GLuint argument = 0; argument < n_arguments; ++argument)
	{
		Utils::_variable_type argument_type = function_object.getArgumentType(argument);
		const glw::GLchar*	uniform_name  = getUniformName(argument);
		std::string			  uniform_type  = Utils::getVariableTypeString(argument_type);

		Utils::replaceToken(argument_definition_token, search_position, argument_definition, string);

		search_position -= argument_definition_length;

		Utils::replaceToken(uniform_type_token, search_position, uniform_type.c_str(), string);
		Utils::replaceToken(uniform_name_token, search_position, uniform_name, string);
	}

	/* Remove ARGUMENT_DEFINITION */
	Utils::replaceToken(argument_definition_token, search_position, "", string);

	/* Replace RESULT_DEFINITION with definitions */
	for (glw::GLuint result = 0; result < n_results; ++result)
	{
		Utils::_variable_type variable_type = function_object.getResultType(result);
		const glw::GLchar*	varying_name  = getVaryingName(result);
		std::string			  varying_type  = Utils::getVariableTypeString(variable_type);

		Utils::replaceToken(result_definition_token, search_position, result_definition, string);

		search_position -= result_definition_length;

		Utils::replaceToken(result_type_token, search_position, varying_type.c_str(), string);
		Utils::replaceToken(result_name_token, search_position, varying_name, string);
	}

	/* Remove RESULT_DEFINITION */
	Utils::replaceToken(result_definition_token, search_position, "", string);

	/* Replace RESULT_NAME */
	Utils::replaceToken(result_name_token, search_position, getVaryingName(0), string);

	/* Replace RESULT_TYPE */
	Utils::replaceToken(result_type_token, search_position, result_type.c_str(), string);

	/* Replace FUNCTION_NAME */
	Utils::replaceToken(function_name_token, search_position, function_object.getName(), string);

	/* Replace ARGUMENT with list of arguments */
	for (glw::GLuint argument = 0; argument < n_arguments; ++argument)
	{
		const glw::GLchar* uniform_name = getUniformName(argument);

		if (0 == argument)
		{
			Utils::replaceToken(argument_token, search_position, first_argument, string);
		}
		else
		{
			Utils::replaceToken(argument_token, search_position, argument_str, string);
		}

		search_position -= first_argument_length;

		Utils::replaceToken(uniform_name_token, search_position, uniform_name, string);
	}

	for (glw::GLuint result = 1; result < n_results; ++result)
	{
		const glw::GLchar* varying_name = getVaryingName(result);

		Utils::replaceToken(argument_token, search_position, argument_str, string);

		search_position -= first_argument_length;

		Utils::replaceToken(uniform_name_token, search_position, varying_name, string);
	}

	/* Remove ARGUMENT */
	Utils::replaceToken(argument_token, search_position, "", string);

	m_vertex_shader_code = string;
}